

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

void tlb_reset_dirty_range_locked
               (uc_struct_conflict15 *uc,CPUTLBEntry *tlb_entry,uintptr_t start,uintptr_t length)

{
  uint uVar1;
  uintptr_t addr;
  uintptr_t length_local;
  uintptr_t start_local;
  CPUTLBEntry *tlb_entry_local;
  uc_struct_conflict15 *uc_local;
  
  uVar1 = *(uint *)((long)&tlb_entry->field_0 + 4);
  if (((uVar1 & 0x3900) == 0) &&
     ((*(long *)((long)&tlb_entry->field_0 + 0x10) + ((ulong)uVar1 & 0xffffc000)) - start < length))
  {
    *(uint *)((long)&tlb_entry->field_0 + 4) = *(uint *)((long)&tlb_entry->field_0 + 4) | 0x1000;
  }
  return;
}

Assistant:

static void tlb_reset_dirty_range_locked(struct uc_struct *uc, CPUTLBEntry *tlb_entry,
                                         uintptr_t start, uintptr_t length)
{
    uintptr_t addr = tlb_entry->addr_write;

    if ((addr & (TLB_INVALID_MASK | TLB_MMIO |
                 TLB_DISCARD_WRITE | TLB_NOTDIRTY)) == 0) {
        addr &= TARGET_PAGE_MASK;
        addr += tlb_entry->addend;
        if ((addr - start) < length) {
#if TCG_OVERSIZED_GUEST
            tlb_entry->addr_write |= TLB_NOTDIRTY;
#else
            tlb_entry->addr_write = tlb_entry->addr_write | TLB_NOTDIRTY;
#endif
        }
    }
}